

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderProgram.cpp
# Opt level: O1

void __thiscall glu::Program::Program(Program *this,RenderContext *renderCtx)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  
  iVar1 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
  this->m_gl = (Functions *)CONCAT44(extraout_var,iVar1);
  this->m_program = 0;
  (this->m_info).infoLog._M_dataplus._M_p = (pointer)&(this->m_info).infoLog.field_2;
  (this->m_info).infoLog._M_string_length = 0;
  (this->m_info).infoLog.field_2._M_local_buf[0] = '\0';
  (this->m_info).linkOk = false;
  (this->m_info).linkTimeUs = 0;
  dVar2 = (**(code **)((Functions *)CONCAT44(extraout_var,iVar1) + 0x3c8))();
  this->m_program = dVar2;
  dVar2 = (**(code **)(this->m_gl + 0x800))();
  checkError(dVar2,"glCreateProgram()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluShaderProgram.cpp"
             ,0xb4);
  return;
}

Assistant:

Program::Program (const RenderContext& renderCtx)
	: m_gl		(renderCtx.getFunctions())
	, m_program	(0)
{
	m_program = m_gl.createProgram();
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glCreateProgram()");
}